

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprsstm.cpp
# Opt level: O1

CTPNStm * __thiscall CTcParser::parse_do_while(CTcParser *this,int *err)

{
  CTPNStmEnclosing *pCVar1;
  int iVar2;
  CTPNStmEnclosing *this_00;
  CTPNStm *pCVar3;
  CTcTokFileDesc *pCVar4;
  
  this_00 = (CTPNStmEnclosing *)CTcPrsAllocObj::operator_new((CTcPrsAllocObj *)0x58,(size_t)err);
  pCVar1 = this->enclosing_stm_;
  CTPNStmBase::CTPNStmBase((CTPNStmBase *)this_00);
  this_00->enclosing_ = pCVar1;
  this_00[1].super_CTPNStm.super_CTPNStmBase.file_ = (CTcTokFileDesc *)0x0;
  this_00[1].super_CTPNStm.super_CTPNStmBase.linenum_ = 0;
  pCVar4 = (CTcTokFileDesc *)(this_00->super_CTPNStm).super_CTPNStmBase.linenum_;
  this_00[1].super_CTPNStm.super_CTPNStmBase.super_CTcPrsNode.super_CTcPrsNodeBase.
  _vptr_CTcPrsNodeBase = (_func_int **)(this_00->super_CTPNStm).super_CTPNStmBase.file_;
  this_00[1].super_CTPNStm.super_CTPNStmBase.next_stm_ = (CTPNStm *)pCVar4;
  (this_00->super_CTPNStm).super_CTPNStmBase.super_CTcPrsNode.super_CTcPrsNodeBase.
  _vptr_CTcPrsNodeBase = (_func_int **)&PTR_gen_code_00365c40;
  CTcTokenizer::next(G_tok);
  pCVar1 = this->enclosing_stm_;
  this->enclosing_stm_ = this_00;
  pCVar3 = parse_stm(this,err,(CTPNStmSwitch *)0x0,0);
  this->enclosing_stm_ = pCVar1;
  if (*err == 0) {
    if ((G_tok->curtok_).typ_ == TOKT_WHILE) {
      CTcTokenizer::next(G_tok);
    }
    else {
      CTcTokenizer::log_error_curtok(G_tok,0x2b42);
    }
    if ((G_tok->curtok_).typ_ == TOKT_LPAR) {
      CTcTokenizer::next(G_tok);
    }
    else {
      CTcTokenizer::log_error_curtok(G_tok,0x2b3f);
    }
    pCVar4 = (CTcTokFileDesc *)parse_cond_expr(this);
    if (pCVar4 != (CTcTokFileDesc *)0x0) {
      if ((G_tok->curtok_).typ_ == TOKT_RPAR) {
        CTcTokenizer::next(G_tok);
      }
      else {
        CTcTokenizer::log_error_curtok(G_tok,0x2b40);
      }
      this_00[1].super_CTPNStm.super_CTPNStmBase.file_ = pCVar4;
      this_00[1].super_CTPNStm.super_CTPNStmBase.linenum_ = (long)pCVar3;
      pCVar4 = (CTcTokFileDesc *)G_tok->last_linenum_;
      this_00[1].super_CTPNStm.super_CTPNStmBase.super_CTcPrsNode.super_CTcPrsNodeBase.
      _vptr_CTcPrsNodeBase = (_func_int **)G_tok->last_desc_;
      this_00[1].super_CTPNStm.super_CTPNStmBase.next_stm_ = (CTPNStm *)pCVar4;
      iVar2 = parse_req_sem();
      if (iVar2 == 0) {
        return &this_00->super_CTPNStm;
      }
    }
    *err = 1;
  }
  return (CTPNStm *)0x0;
}

Assistant:

CTPNStm *CTcParser::parse_do_while(int *err)
{
    CTPNStm *body_stm;
    CTcPrsNode *expr;
    CTPNStmDoWhile *do_stm;
    CTPNStmEnclosing *old_enclosing;
    
    /* create the statement object */
    do_stm = new CTPNStmDoWhile(enclosing_stm_);

    /* skip the 'do' keyword */
    G_tok->next();

    /* set the 'do' to be the enclosing statement */
    old_enclosing = set_enclosing_stm(do_stm);

    /* parse the loop body */
    body_stm = parse_stm(err, 0, FALSE);

    /* restore the enclosing statement */
    set_enclosing_stm(old_enclosing);

    /* return on failure */
    if (*err)
        return 0;

    /* require the 'while' keyword */
    if (G_tok->cur() == TOKT_WHILE)
    {
        /* skip the 'while' */
        G_tok->next();
    }
    else
    {
        /* 
         *   no 'while' keyword - there's no obvious way to correct this,
         *   so simply ignore the 'do' statement and keep going from here,
         *   on the assumption that they inadvertantly started a new
         *   statement without finishing the 'do' 
         */
        G_tok->log_error_curtok(TCERR_REQ_DO_WHILE);
    }

    /* require the open paren */
    if (G_tok->cur() == TOKT_LPAR)
        G_tok->next();
    else
        G_tok->log_error_curtok(TCERR_REQ_WHILE_LPAR);

    /* parse the expression */
    expr = parse_cond_expr();
    if (expr == 0)
    {
        *err = TRUE;
        return 0;
    }

    /* require the close paren */
    if (G_tok->cur() == TOKT_RPAR)
        G_tok->next();
    else
        G_tok->log_error_curtok(TCERR_REQ_WHILE_RPAR);

    /* set the condition expression and body in the 'do' node */
    do_stm->set_cond(expr);
    do_stm->set_body(body_stm);

    /* 
     *   remember the location of the 'while' part, since this part
     *   generates code 
     */
    do_stm->set_while_pos(G_tok->get_last_desc(), G_tok->get_last_linenum());

    /* parse the required closing semicolon */
    if (parse_req_sem())
    {
        *err = TRUE;
        return 0;
    }

    /* return the new 'do-while' node */
    return do_stm;
}